

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void Curl_persistconninfo(connectdata *conn)

{
  connectdata *conn_local;
  
  memcpy((conn->data->info).conn_primary_ip,conn->primary_ip,0x2e);
  memcpy((conn->data->info).conn_local_ip,conn->local_ip,0x2e);
  (conn->data->info).conn_scheme = conn->handler->scheme;
  (conn->data->info).conn_protocol = conn->handler->protocol;
  (conn->data->info).conn_primary_port = conn->primary_port;
  (conn->data->info).conn_local_port = conn->local_port;
  return;
}

Assistant:

void Curl_persistconninfo(struct connectdata *conn)
{
  memcpy(conn->data->info.conn_primary_ip, conn->primary_ip, MAX_IPADR_LEN);
  memcpy(conn->data->info.conn_local_ip, conn->local_ip, MAX_IPADR_LEN);
  conn->data->info.conn_scheme = conn->handler->scheme;
  conn->data->info.conn_protocol = conn->handler->protocol;
  conn->data->info.conn_primary_port = conn->primary_port;
  conn->data->info.conn_local_port = conn->local_port;
}